

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBarsH<unsigned_int>
               (char *label_id,uint *xs,uint *ys,uint *neg,uint *pos,int count,int offset,int stride
               )

{
  undefined1 local_68 [8];
  GetterError<unsigned_int> getter;
  int count_local;
  uint *pos_local;
  uint *neg_local;
  uint *ys_local;
  uint *xs_local;
  char *label_id_local;
  
  getter._44_4_ = count;
  GetterError<unsigned_int>::GetterError
            ((GetterError<unsigned_int> *)local_68,xs,ys,neg,pos,count,offset,stride);
  PlotErrorBarsHEx<ImPlot::GetterError<unsigned_int>>
            (label_id,(GetterError<unsigned_int> *)local_68);
  return;
}

Assistant:

void PlotErrorBarsH(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsHEx(label_id, getter);
}